

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

bool __thiscall mpt::encode_array::shift(encode_array *this,size_t len)

{
  content *pcVar1;
  ulong uVar2;
  
  uVar2 = (this->_state).done;
  if (len == 0) {
    pcVar1 = (this->_d)._buf._ref;
    if (pcVar1 == (content *)0x0) {
      return false;
    }
    if (*(long *)(pcVar1 + 8) != 0) {
      return false;
    }
    uVar2 = uVar2 + (this->_state).scratch;
    if (*(ulong *)(pcVar1 + 0x18) <= uVar2) {
      return false;
    }
    memcpy(pcVar1 + 0x20,pcVar1 + 0x20 + -uVar2,uVar2);
    array::set(&this->_d,uVar2,(void *)0x0);
  }
  else {
    if (uVar2 < len) {
      return false;
    }
    (this->_state).done = uVar2 - len;
  }
  return true;
}

Assistant:

bool encode_array::shift(size_t len)
{
	// move data segment to front
	if (!len) {
		size_t max, len = _state.done + _state.scratch;
		if ((max = _d.length() <= len)) {
			return false;
		}
		uint8_t *d = reinterpret_cast<uint8_t *>(_d.base());
		size_t shift = max - len;
		memcpy(d, d + shift, len);
		_d.set(len);
		return true;
	}
	// consume terminated data
	if (len > _state.done) {
		return false;
	}
	_state.done -= len;
	return true;
}